

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathCastToString(xmlXPathObjectPtr val)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  xmlChar *pxVar4;
  
  if (val == (xmlXPathObjectPtr)0x0) {
switchD_001df545_caseD_0:
    pxVar4 = xmlStrdup("");
    return pxVar4;
  }
  switch(val->type) {
  case XPATH_UNDEFINED:
    goto switchD_001df545_caseD_0;
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    pxVar4 = xmlXPathCastNodeSetToString(val->nodesetval);
    return pxVar4;
  case XPATH_BOOLEAN:
    if (val->boolval == 0) {
      pxVar4 = xmlStrdup((xmlChar *)"false");
      return pxVar4;
    }
    pxVar4 = xmlStrdup((xmlChar *)"true");
    return pxVar4;
  case XPATH_NUMBER:
    pxVar4 = xmlXPathCastNumberToString(val->floatval);
    return pxVar4;
  case XPATH_STRING:
    pxVar4 = xmlStrdup(val->stringval);
    return pxVar4;
  case XPATH_POINT:
  case XPATH_RANGE:
  case XPATH_LOCATIONSET:
  case XPATH_USERS:
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"Unimplemented block at %s:%d\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c",
              0x1694);
    pxVar4 = xmlStrdup("");
    return pxVar4;
  default:
    return (xmlChar *)0x0;
  }
}

Assistant:

xmlChar *
xmlXPathCastToString(xmlXPathObjectPtr val) {
    xmlChar *ret = NULL;

    if (val == NULL)
	return(xmlStrdup((const xmlChar *) ""));
    switch (val->type) {
	case XPATH_UNDEFINED:
#ifdef DEBUG_EXPR
	    xmlGenericError(xmlGenericErrorContext, "String: undefined\n");
#endif
	    ret = xmlStrdup((const xmlChar *) "");
	    break;
        case XPATH_NODESET:
        case XPATH_XSLT_TREE:
	    ret = xmlXPathCastNodeSetToString(val->nodesetval);
	    break;
	case XPATH_STRING:
	    return(xmlStrdup(val->stringval));
        case XPATH_BOOLEAN:
	    ret = xmlXPathCastBooleanToString(val->boolval);
	    break;
	case XPATH_NUMBER: {
	    ret = xmlXPathCastNumberToString(val->floatval);
	    break;
	}
	case XPATH_USERS:
	case XPATH_POINT:
	case XPATH_RANGE:
	case XPATH_LOCATIONSET:
	    TODO
	    ret = xmlStrdup((const xmlChar *) "");
	    break;
    }
    return(ret);
}